

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

size_t __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::Count
          (IEnumerableCore<linq::IEnumerable<int_&>_> *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  iterator __begin0;
  iterator __end0;
  iterator local_90;
  iterator local_70;
  iterator local_50;
  
  begin(&local_90,this);
  end(&local_50,this);
  sVar3 = 0;
  while( true ) {
    local_70.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00158638;
    local_70.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_50.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    local_70.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_50.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_50.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.source.state.
              super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
             ->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.source.state.
              super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
             ->_M_use_count + 1;
      }
    }
    local_70.valid = local_50.valid;
    bVar1 = iterator::operator!=(&local_90,&local_70);
    local_70.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00158638;
    if (local_70.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.source.state.
                 super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (!bVar1) break;
    (*(local_90.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_IState[3])();
    (*(local_90.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_IState[2])();
    sVar3 = sVar3 + 1;
    iVar2 = (*(local_90.source.state.
               super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[1])();
    local_90.valid = SUB41(iVar2,0);
  }
  local_50.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00158638;
  if (local_50.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.source.state.
               super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  local_90.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00158638;
  if (local_90.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.source.state.
               super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return sVar3;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}